

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fct.h
# Opt level: O1

void fctkern__log_test_skip(fctkern_t *nk,char *condition,char *name)

{
  size_t sVar1;
  void *pvVar2;
  ulong uVar3;
  
  sVar1 = (nk->logger_list).used_itm_num;
  if (sVar1 != 0) {
    uVar3 = 0;
    do {
      if ((nk->logger_list).used_itm_num <= uVar3) {
        __assert_fail("idx < list->used_itm_num",
                      "/workspace/llm4binary/github/license_c_cmakelists/imb[P]fctx/include/fct.h",
                      0x322,"void *fct_nlist__at(const fct_nlist_t *, size_t)");
      }
      pvVar2 = (nk->logger_list).itm_list[uVar3];
      *(char **)((long)pvVar2 + 0x80) = condition;
      *(char **)((long)pvVar2 + 0x88) = name;
      (**(code **)((long)pvVar2 + 0x50))(pvVar2,(long)pvVar2 + 0x58);
      uVar3 = uVar3 + 1;
    } while (sVar1 != uVar3);
  }
  return;
}

Assistant:

static void
fctkern__log_test_skip(fctkern_t *nk, char const *condition, char const *name)
{
    FCT_NLIST_FOREACH_BGN(fct_logger_i*, logger, &(nk->logger_list))
    {
        fct_logger__on_test_skip(logger, condition, name);
    }
    FCT_NLIST_FOREACH_END();
}